

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::reserve
          (vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this,size_t n)

{
  memory_resource *pmVar1;
  double *pdVar2;
  size_t sVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  double *pdVar5;
  
  if (n <= this->nAlloc) {
    return;
  }
  if (n * 8 == 0) {
    pdVar5 = (double *)0x0;
  }
  else {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 8,8);
    pdVar5 = (double *)CONCAT44(extraout_var,iVar4);
  }
  pdVar2 = this->ptr;
  sVar3 = this->nStored;
  if (sVar3 == 0) {
    if (pdVar2 == (double *)0x0) goto LAB_00319541;
  }
  else {
    sVar6 = 0;
    do {
      pdVar5[sVar6] = pdVar2[sVar6];
      sVar6 = sVar6 + 1;
    } while (sVar3 != sVar6);
  }
  pmVar1 = (this->alloc).memoryResource;
  (*pmVar1->_vptr_memory_resource[3])(pmVar1,pdVar2,this->nAlloc << 3,8);
LAB_00319541:
  this->nAlloc = n;
  this->ptr = pdVar5;
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }